

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::handleProtectLicense
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_4)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  bool bVar1;
  ParenPragmaExpressionSyntax *pPVar2;
  PragmaExpressionSyntax *pPVar3;
  SyntaxNode *this_00;
  SimplePragmaExpressionSyntax *pSVar4;
  SyntaxNode *in_RCX;
  SourceLocation in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view name;
  NameValuePragmaExpressionSyntax *nvp;
  PragmaExpressionSyntax *arg;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  Diagnostic *in_stack_fffffffffffffe18;
  Diagnostic *in_stack_fffffffffffffe20;
  Preprocessor *in_stack_fffffffffffffe28;
  SourceLocation in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  DiagCode in_stack_fffffffffffffe44;
  string_view in_stack_fffffffffffffe48;
  SourceRange in_stack_fffffffffffffe58;
  SourceLocation this_01;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffffe70;
  string_view local_c0;
  NameValuePragmaExpressionSyntax *local_b0;
  string_view local_a8;
  SourceRange local_98;
  undefined4 local_84;
  SyntaxNode *local_80;
  const_iterator local_78;
  const_iterator local_68;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *local_58;
  string_view local_50;
  SourceRange local_40;
  undefined4 local_2c;
  SyntaxNode *local_20;
  
  this_01 = in_stack_fffffffffffffe58.endLoc;
  local_20 = in_RCX;
  if ((in_RCX != (SyntaxNode *)0x0) && (in_RCX->kind == ParenPragmaExpression)) {
    slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>(in_RCX);
    bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::empty
                      ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x2e7760);
    this_01 = in_stack_fffffffffffffe58.endLoc;
    if (!bVar1) {
      pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>(local_20);
      local_58 = &pPVar2->values;
      local_68 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
                           ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x2e7845);
      local_78 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end
                           ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x2e7862);
      do {
        bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>_>
                          ((self_type *)in_stack_fffffffffffffe20,
                           (iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)
                           in_stack_fffffffffffffe18);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          return;
        }
        local_80 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                                 *)0x2e789f)->super_SyntaxNode;
        if (local_80->kind == NameValuePragmaExpression) {
          local_b0 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                               (local_80);
          local_c0 = Token::valueText((Token *)in_RDI);
          sv((char *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
          bVar5._M_str._0_4_ = in_stack_fffffffffffffe40;
          bVar5._M_len = (size_t)in_stack_fffffffffffffe38;
          bVar5._M_str._4_4_ = in_stack_fffffffffffffe44;
          bVar1 = std::operator==(in_stack_fffffffffffffe48,bVar5);
          if (!bVar1) {
            sv((char *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
            __y._M_str._0_4_ = in_stack_fffffffffffffe40;
            __y._M_len = (size_t)in_stack_fffffffffffffe38;
            __y._M_str._4_4_ = in_stack_fffffffffffffe44;
            bVar1 = std::operator==(in_stack_fffffffffffffe48,__y);
            if (!bVar1) {
              sv((char *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
              __y_00._M_str._0_4_ = in_stack_fffffffffffffe40;
              __y_00._M_len = (size_t)in_stack_fffffffffffffe38;
              __y_00._M_str._4_4_ = in_stack_fffffffffffffe44;
              bVar1 = std::operator==(in_stack_fffffffffffffe48,__y_00);
              if (!bVar1) {
                bVar5 = sv((char *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
                __y_01._M_str._0_4_ = in_stack_fffffffffffffe40;
                __y_01._M_len = (size_t)in_stack_fffffffffffffe38;
                __y_01._M_str._4_4_ = in_stack_fffffffffffffe44;
                bVar1 = std::operator==(in_stack_fffffffffffffe48,__y_01);
                if (!bVar1) {
                  sv((char *)in_stack_fffffffffffffe20,(size_t)in_stack_fffffffffffffe18);
                  __y_02._M_str._0_4_ = in_stack_fffffffffffffe40;
                  __y_02._M_len = (size_t)in_stack_fffffffffffffe38;
                  __y_02._M_str._4_4_ = in_stack_fffffffffffffe44;
                  bVar1 = std::operator==(in_stack_fffffffffffffe48,__y_02);
                  if (bVar1) {
                    not_null<slang::syntax::PragmaExpressionSyntax_*>::operator*
                              ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x2e7c68);
                    in_stack_fffffffffffffe70 =
                         (_Optional_payload_base<unsigned_int>)
                         requireUInt32((Preprocessor *)bVar5._M_str,
                                       (PragmaExpressionSyntax *)bVar5._M_len);
                  }
                  else {
                    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_c0);
                    if (!bVar1) {
                      in_stack_fffffffffffffe6c = 0x2e0004;
                      in_stack_fffffffffffffe58 =
                           Token::range((Token *)CONCAT44(in_stack_fffffffffffffe44,
                                                          in_stack_fffffffffffffe40));
                      range_02.endLoc = in_stack_fffffffffffffe38;
                      range_02.startLoc = in_RDI;
                      in_stack_fffffffffffffe18 =
                           addDiag(in_stack_fffffffffffffe28,in_stack_fffffffffffffe44,range_02);
                      in_stack_fffffffffffffe48 = Token::valueText((Token *)in_RDI);
                      arg_03._M_len._4_4_ = in_stack_fffffffffffffe6c;
                      arg_03._M_len._0_4_ = in_stack_fffffffffffffe68;
                      arg_03._M_str = (char *)in_stack_fffffffffffffe70;
                      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe58.endLoc,arg_03);
                      in_stack_fffffffffffffe40 = local_c0._M_str._0_4_;
                      in_stack_fffffffffffffe44 = local_c0._M_str._4_4_;
                      arg_04._M_len._4_4_ = in_stack_fffffffffffffe6c;
                      arg_04._M_len._0_4_ = in_stack_fffffffffffffe68;
                      arg_04._M_str = (char *)in_stack_fffffffffffffe70;
                      in_stack_fffffffffffffe38 = (SourceLocation)local_c0._M_len;
                      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe58.endLoc,arg_04);
                    }
                  }
                  goto LAB_002e7d31;
                }
              }
            }
          }
          pPVar3 = not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->
                             ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x2e7b43);
          if ((pPVar3->super_SyntaxNode).kind == SimplePragmaExpression) {
            this_00 = &not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->
                                 ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x2e7b5c)->
                       super_SyntaxNode;
            pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                               (this_00);
            if ((pSVar4->value).kind == StringLiteral) goto LAB_002e7d31;
          }
          not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->
                    ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)0x2e7b8d);
          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe70);
          range_01.endLoc = in_stack_fffffffffffffe38;
          range_01.startLoc = in_RDI;
          addDiag(in_stack_fffffffffffffe28,in_stack_fffffffffffffe44,range_01);
          arg_02._M_len._4_4_ = in_stack_fffffffffffffe6c;
          arg_02._M_len._0_4_ = in_stack_fffffffffffffe68;
          arg_02._M_str = (char *)in_stack_fffffffffffffe70;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe58.endLoc,arg_02);
        }
        else {
          local_84 = 0x270004;
          local_98 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe70)
          ;
          range_00.endLoc = in_stack_fffffffffffffe38;
          range_00.startLoc = in_RDI;
          in_stack_fffffffffffffe20 =
               addDiag(in_stack_fffffffffffffe28,in_stack_fffffffffffffe44,range_00);
          local_a8 = Token::valueText((Token *)in_RDI);
          arg_01._M_len._4_4_ = in_stack_fffffffffffffe6c;
          arg_01._M_len._0_4_ = in_stack_fffffffffffffe68;
          arg_01._M_str = (char *)in_stack_fffffffffffffe70;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe58.endLoc,arg_01);
        }
LAB_002e7d31:
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                    *)in_stack_fffffffffffffe20);
      } while( true );
    }
  }
  local_2c = 0x270004;
  if (local_20 == (SyntaxNode *)0x0) {
    local_40 = Token::range((Token *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  else {
    local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe70);
  }
  range.endLoc = in_stack_fffffffffffffe38;
  range.startLoc = in_RDI;
  addDiag(in_stack_fffffffffffffe28,in_stack_fffffffffffffe44,range);
  local_50 = Token::valueText((Token *)in_RDI);
  arg_00._M_len._4_4_ = in_stack_fffffffffffffe6c;
  arg_00._M_len._0_4_ = in_stack_fffffffffffffe68;
  arg_00._M_str = (char *)in_stack_fffffffffffffe70;
  Diagnostic::operator<<((Diagnostic *)this_01,arg_00);
  return;
}

Assistant:

void Preprocessor::handleProtectLicense(Token keyword, const PragmaExpressionSyntax* args,
                                        SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "library"sv || name == "entry"sv || name == "feature"sv || name == "exit"sv) {
            if (nvp.value->kind != SyntaxKind::SimplePragmaExpression ||
                nvp.value->as<SimplePragmaExpressionSyntax>().value.kind !=
                    TokenKind::StringLiteral) {
                addDiag(diag::ExpectedProtectArg, nvp.value->sourceRange()) << name;
            }
        }
        else if (name == "match"sv) {
            requireUInt32(*nvp.value);
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}